

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kernel_svm.cc
# Opt level: O1

void sync_queries(vw *all,svm_params *params,bool *train_pool)

{
  flat_example *__ptr;
  vw *all_00;
  int iVar1;
  io_buf *piVar2;
  unsigned_long *buffer;
  char *buffer_00;
  svm_example *psVar3;
  ulong uVar4;
  ulong uVar5;
  char *pcVar6;
  size_t nmemb;
  char *pcVar7;
  flat_example *fec;
  flat_example *local_60;
  io_buf *local_58;
  vw *local_50;
  unsigned_long *local_48;
  v_array<char> *local_40;
  bool *local_38;
  
  local_50 = all;
  piVar2 = (io_buf *)operator_new(0xa8);
  piVar2->_vptr_io_buf = (_func_int **)&PTR_open_file_002caf40;
  local_40 = &piVar2->space;
  (piVar2->space)._begin = (char *)0x0;
  (piVar2->space)._end = (char *)0x0;
  (piVar2->space).end_array = (char *)0x0;
  (piVar2->space).erase_count = 0;
  (piVar2->files)._begin = (int *)0x0;
  (piVar2->files)._end = (int *)0x0;
  (piVar2->files).end_array = (int *)0x0;
  (piVar2->files).erase_count = 0;
  (piVar2->currentname)._begin = (char *)0x0;
  (piVar2->currentname)._end = (char *)0x0;
  (piVar2->currentname).end_array = (char *)0x0;
  (piVar2->currentname).erase_count = 0;
  (piVar2->finalname)._begin = (char *)0x0;
  (piVar2->finalname)._end = (char *)0x0;
  (piVar2->finalname).end_array = (char *)0x0;
  (piVar2->finalname).erase_count = 0;
  v_array<char>::resize(local_40,0x10000);
  piVar2->count = 0;
  piVar2->current = 0;
  piVar2->head = (piVar2->space)._begin;
  piVar2->_verify_hash = false;
  piVar2->_hash = 0;
  local_60 = (flat_example *)0x0;
  if (params->pool_pos != 0) {
    uVar5 = 0;
    do {
      if (train_pool[uVar5] == true) {
        local_60 = &params->pool[uVar5]->ex;
        save_load_flat_example(piVar2,false,&local_60);
        psVar3 = params->pool[uVar5];
        if (psVar3 != (svm_example *)0x0) {
          svm_example::~svm_example(psVar3);
          operator_delete(psVar3);
        }
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 < params->pool_pos);
  }
  all_00 = local_50;
  local_38 = train_pool;
  buffer = calloc_or_throw<unsigned_long>(local_50->all_reduce->total);
  buffer[all_00->all_reduce->node] = (long)piVar2->head - (long)(piVar2->space)._begin;
  local_58 = piVar2;
  all_reduce<unsigned_long,_&add_size_t>(all_00,buffer,all_00->all_reduce->total);
  piVar2 = local_58;
  uVar5 = all_00->all_reduce->total;
  if (uVar5 == 0) {
    pcVar7 = (char *)0x0;
    nmemb = 0;
  }
  else {
    uVar4 = 0;
    nmemb = 0;
    pcVar7 = (char *)0x0;
    do {
      if (uVar4 <= all_00->all_reduce->node - 1) {
        pcVar7 = pcVar7 + buffer[uVar4];
      }
      nmemb = nmemb + buffer[uVar4];
      uVar4 = uVar4 + 1;
    } while (uVar5 != uVar4);
  }
  if (nmemb != 0) {
    local_48 = buffer;
    buffer_00 = calloc_or_throw<char>(nmemb);
    pcVar6 = (piVar2->space)._begin;
    memcpy(buffer_00 + (long)pcVar7,pcVar6,(long)piVar2->head - (long)pcVar6);
    pcVar6 = (piVar2->space)._begin;
    if (pcVar6 != (char *)0x0) {
      free(pcVar6);
    }
    local_40->_begin = (char *)0x0;
    local_40->_end = (char *)0x0;
    local_40->end_array = (char *)0x0;
    all_reduce<char,_&copy_char>(local_50,buffer_00,nmemb);
    (local_58->space)._begin = buffer_00;
    local_58->head = buffer_00;
    (local_58->space)._end = buffer_00 + nmemb;
    params->pool_pos = 0;
    buffer = local_48;
    if (params->pool_size != 0) {
      uVar5 = 0;
      pcVar6 = (char *)0x0;
      do {
        buffer = local_48;
        piVar2 = local_58;
        iVar1 = save_load_flat_example(local_58,true,&local_60);
        if (iVar1 != 0) break;
        psVar3 = calloc_or_throw<svm_example>(1);
        __ptr = local_60;
        params->pool[uVar5] = psVar3;
        memcpy(&params->pool[uVar5]->ex,local_60,200);
        free(__ptr);
        local_38[uVar5] = true;
        params->pool_pos = params->pool_pos + 1;
        pcVar6 = piVar2->head + ((long)pcVar6 - (long)(piVar2->space)._begin);
        if (pcVar6 == pcVar7) {
          params->local_begin = uVar5 + 1;
        }
        if (pcVar6 == pcVar7 + local_48[local_50->all_reduce->node]) {
          params->local_end = uVar5;
        }
        uVar5 = uVar5 + 1;
        buffer = local_48;
      } while (uVar5 < params->pool_size);
    }
  }
  if (local_60 != (flat_example *)0x0) {
    free(local_60);
  }
  free(buffer);
  (*local_58->_vptr_io_buf[3])();
  return;
}

Assistant:

void sync_queries(vw& all, svm_params& params, bool* train_pool)
{
  io_buf* b = new io_buf();

  char* queries;
  flat_example* fec = nullptr;

  for (size_t i = 0; i < params.pool_pos; i++)
  {
    if (!train_pool[i])
      continue;

    fec = &(params.pool[i]->ex);
    save_load_flat_example(*b, false, fec);
    delete params.pool[i];
  }

  size_t* sizes = calloc_or_throw<size_t>(all.all_reduce->total);
  sizes[all.all_reduce->node] = b->head - b->space.begin();
  // params.all->opts_n_args.trace_message<<"Sizes = "<<sizes[all.node]<<" ";
  all_reduce<size_t, add_size_t>(all, sizes, all.all_reduce->total);

  size_t prev_sum = 0, total_sum = 0;
  for (size_t i = 0; i < all.all_reduce->total; i++)
  {
    if (i <= (all.all_reduce->node - 1))
      prev_sum += sizes[i];
    total_sum += sizes[i];
  }

  // params.all->opts_n_args.trace_message<<total_sum<<" "<<prev_sum<<endl;
  if (total_sum > 0)
  {
    queries = calloc_or_throw<char>(total_sum);
    memcpy(queries + prev_sum, b->space.begin(), b->head - b->space.begin());
    b->space.delete_v();
    all_reduce<char, copy_char>(all, queries, total_sum);

    b->space.begin() = queries;
    b->head = b->space.begin();
    b->space.end() = &queries[total_sum * sizeof(char)];

    size_t num_read = 0;
    params.pool_pos = 0;

    for (size_t i = 0; i < params.pool_size; i++)
    {
      if (!save_load_flat_example(*b, true, fec))
      {
        params.pool[i] = &calloc_or_throw<svm_example>();
        params.pool[i]->init_svm_example(fec);
        train_pool[i] = true;
        params.pool_pos++;
        // for(int j = 0;j < fec->feature_map_len;j++)
        //   params.all->opts_n_args.trace_message<<fec->feature_map[j].weight_index<<":"<<fec->feature_map[j].x<<" ";
        // params.all->opts_n_args.trace_message<<endl;
        // params.pool[i]->in_use = true;
        // params.current_t += ((label_data*) params.pool[i]->ld)->weight;
        // params.pool[i]->example_t = params.current_t;
      }
      else
        break;

      num_read += b->head - b->space.begin();
      if (num_read == prev_sum)
        params.local_begin = i + 1;
      if (num_read == prev_sum + sizes[all.all_reduce->node])
        params.local_end = i;
    }
  }
  if (fec)
    free(fec);
  free(sizes);
  delete b;
}